

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O3

size_t __thiscall kws::Parser::IsTemplated(Parser *this,string *buffer,size_t classnamepos)

{
  char cVar1;
  pointer pcVar2;
  int iVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  
  uVar6 = std::__cxx11::string::find((char *)buffer,0x176130,0);
  uVar8 = uVar6;
  do {
    uVar5 = uVar6;
    if (classnamepos <= uVar5) {
      return uVar8;
    }
    lVar7 = std::__cxx11::string::find((char *)buffer,0x176488,uVar5);
    if (lVar7 != -1) {
      pcVar2 = (buffer->_M_dataplus)._M_p;
      uVar8 = lVar7 + 1;
      iVar9 = 1;
      do {
        if (classnamepos <= uVar8) goto LAB_00123f60;
        cVar1 = pcVar2[uVar8];
        iVar3 = -(uint)(cVar1 == '>');
        if (cVar1 == '<') {
          iVar3 = 1;
        }
        uVar8 = uVar8 + 1;
        iVar9 = iVar9 + iVar3;
      } while (iVar9 != 0);
      if (classnamepos <= uVar8) {
        return uVar5;
      }
      bVar4 = true;
      do {
        cVar1 = pcVar2[uVar8];
        if ((cVar1 != '\n') && (cVar1 != '\r')) {
          bVar4 = (bool)(bVar4 & cVar1 == '\t');
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < classnamepos);
      if (bVar4) {
        return uVar5;
      }
    }
LAB_00123f60:
    uVar6 = std::__cxx11::string::find((char *)buffer,0x176130,uVar5 + 1);
    uVar8 = uVar5;
  } while( true );
}

Assistant:

size_t Parser::IsTemplated(const std::string & buffer, size_t classnamepos) const
{
  size_t templatepos = buffer.find("template",0);
  size_t returnval = templatepos;

  while(templatepos!=std::string::npos && templatepos<classnamepos)
    {
    // find the last > that corresponding to the template
    size_t p0 = buffer.find("<",templatepos);
    size_t pos = std::string::npos;
    if(p0!=std::string::npos)
      {
      size_t i=p0+1;
      unsigned int n=1;

      while(i<classnamepos && n>0)
        {
        if(buffer[i] == '<')
          {
          n++;
          }
        else if(buffer[i] == '>')
          {
          n--;
          }
        if(n==0)
          {
          pos =i;
          break;
          }
        i++;
        }
      }

    if(pos<classnamepos && pos!=std::string::npos)
      {
      bool ok = true;
      // Check if between the last > and classnamepos we don't have words
      for(size_t i=pos+1;i<classnamepos;i++)
        {
        if(buffer.c_str()[i] != 13 && buffer.c_str()[i] != '\n' && buffer.c_str()[i]!= '\t')
          {
          ok = false;
          }
        }
      if(ok)
        {
        return templatepos;
        }
      /*else
        {
        std::cout << "ERROR in Parser::IsTemplated, Cannot find proper template parameters" << std::endl;
        system("PAUSE");
        }*/
      }
    returnval = templatepos;
    templatepos = buffer.find("template",templatepos+1);
    }

  return returnval;
}